

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

ktx_error_code_e ktxPrintKTX2InfoTextForNamedFile(char *filename)

{
  ktx_error_code_e kVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    kVar1 = KTX_FILE_OPEN_FAILED;
  }
  else {
    kVar1 = ktxPrintKTX2InfoTextForStdioStream((FILE *)__stream);
    fclose(__stream);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoTextForNamedFile(const char* const filename)
{
    FILE* file = NULL;

#ifdef _WIN32
    fopen_s(&file, filename, "rb");
#else
    file = fopen(filename, "rb");
#endif

    if (!file)
        return KTX_FILE_OPEN_FAILED;

    KTX_error_code result = ktxPrintKTX2InfoTextForStdioStream(file);

    fclose(file);
    return result;
}